

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

void ReleaseJsRTContext_TTDCallback(FinalizableObject *jsrtCtx)

{
  ScriptContext *this;
  ThreadContext *this_00;
  Recycler *this_01;
  FinalizableObject *jsrtCtx_local;
  
  this = JsrtContext::GetScriptContext((JsrtContext *)jsrtCtx);
  this_00 = Js::ScriptContext::GetThreadContext(this);
  this_01 = ThreadContext::GetRecycler(this_00);
  Memory::Recycler::RootRelease(this_01,jsrtCtx,(uint *)0x0);
  JsrtContext::OnReplayDisposeContext_TTDCallback(jsrtCtx);
  return;
}

Assistant:

void CALLBACK ReleaseJsRTContext_TTDCallback(FinalizableObject* jsrtCtx)
{
    static_cast<JsrtContext*>(jsrtCtx)->GetScriptContext()->GetThreadContext()->GetRecycler()->RootRelease(jsrtCtx);
    JsrtContext::OnReplayDisposeContext_TTDCallback(jsrtCtx);
}